

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(short lhs,
         SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  undefined8 in_RAX;
  short ret;
  undefined8 local_18;
  
  local_18._6_2_ = (unsigned_short)((ulong)in_RAX >> 0x30);
  local_18 = (ulong)CONCAT22(local_18._6_2_,lhs) << 0x20;
  local_18 = CONCAT62(local_18._2_6_,rhs.m_int);
  DivisionHelper<short,_unsigned_short,_4>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((short *)((long)&local_18 + 4),(unsigned_short *)&local_18,
             (short *)((long)&local_18 + 2));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<short>
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             ((long)&local_18 + 6),(short *)((long)&local_18 + 2));
  return (SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         local_18._6_2_;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}